

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O1

qint64 __thiscall
QHttpNetworkReplyPrivate::readHeader(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  ArrayOptions *pAVar1;
  QByteArray *pQVar2;
  QHttpNetworkHeaderPrivate *this_00;
  QHttpHeaderParser *this_01;
  char *pcVar3;
  Data *pDVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  qint64 qVar8;
  long lVar9;
  qint64 qVar10;
  bool bVar11;
  long in_FS_OFFSET;
  QByteArrayView header;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QByteArrayView name_02;
  char c;
  QByteArray local_118;
  QByteArray local_f8;
  QByteArray local_e0;
  QByteArray local_c8;
  QByteArray local_b0;
  QByteArray local_98;
  QByteArray local_78;
  QByteArray local_58;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = &this->fragment;
  if ((this->fragment).d.size == 0) {
    pDVar4 = (pQVar2->d).d;
    if (((pDVar4 == (Data *)0x0) ||
        (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar4->super_QArrayData).alloc) - (long)(this->fragment).d.ptr) < 0x200)) {
      QByteArray::reallocData((longlong)pQVar2,0x200);
    }
    pDVar4 = (pQVar2->d).d;
    if ((pDVar4 != (Data *)0x0) && ((pDVar4->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar4->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  local_39 = '\0';
  qVar10 = 0;
  bVar11 = false;
  while( true ) {
    lVar7 = QIODevice::read((char *)socket,(longlong)&local_39);
    if (lVar7 == -1) {
      qVar10 = -1;
      goto LAB_0020da33;
    }
    if (lVar7 == 0) break;
    QByteArray::append((char)pQVar2);
    if (local_39 == '\n') {
      pcVar3 = (this->fragment).d.ptr;
      lVar9 = (this->fragment).d.size;
      QVar12.m_data = pcVar3;
      QVar12.m_size = lVar9;
      QVar24.m_data = "\n\r\n";
      QVar24.m_size = 3;
      cVar5 = QtPrivate::endsWith(QVar12,QVar24);
      if ((cVar5 != '\0') ||
         (QVar13.m_data = pcVar3, QVar13.m_size = lVar9, QVar25.m_data = "\n\n", QVar25.m_size = 2,
         cVar5 = QtPrivate::endsWith(QVar13,QVar25), cVar5 != '\0')) {
        bVar11 = true;
      }
      if (lVar9 == 1) {
        QVar15.m_data = pcVar3;
        QVar15.m_size = 1;
        QVar27.m_data = "\n";
        QVar27.m_size = 1;
        cVar5 = QtPrivate::endsWith(QVar15,QVar27);
      }
      else {
        if (lVar9 != 2) goto LAB_0020d6b0;
        QVar14.m_data = pcVar3;
        QVar14.m_size = 2;
        QVar26.m_data = "\r\n";
        QVar26.m_size = 2;
        cVar5 = QtPrivate::endsWith(QVar14,QVar26);
      }
      if (cVar5 != '\0') {
        bVar11 = true;
      }
    }
LAB_0020d6b0:
    qVar10 = qVar10 + 1;
    if ((lVar7 < 1) || (bVar11)) break;
  }
  if (!bVar11) goto LAB_0020da33;
  this_01 = &(this->super_QHttpNetworkHeaderPrivate).parser;
  header.m_data = (this->fragment).d.ptr;
  header.m_size = (this->fragment).d.size;
  QHttpHeaderParser::parseHeaders(this_01,header);
  this->state = ReadingDataState;
  QByteArray::clear();
  this_00 = &this->super_QHttpNetworkHeaderPrivate;
  qVar8 = QHttpNetworkHeaderPrivate::contentLength(this_00);
  this->bodyLength = qVar8;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (storage_type *)0x0;
  local_98.d.size = 0;
  name.m_data = "transfer-encoding";
  name.m_size = 0x11;
  QHttpNetworkHeaderPrivate::headerField(&local_78,this_00,name,&local_98);
  QByteArray::toLower_helper(&local_58);
  QVar16.m_data = local_58.d.ptr;
  QVar16.m_size = local_58.d.size;
  QVar20.m_data = "chunked";
  QVar20.m_size = 7;
  lVar7 = QtPrivate::findByteArray(QVar16,0,QVar20);
  this->chunkedTransferEncoding = lVar7 != -1;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (storage_type *)0x0;
  local_78.d.size = 0;
  name_00.m_data = "connection";
  name_00.m_size = 10;
  QHttpNetworkHeaderPrivate::headerField(&local_58,this_00,name_00,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  QByteArray::toLower_helper(&local_78);
  QVar17.m_data = local_78.d.ptr;
  QVar17.m_size = local_78.d.size;
  QVar21.m_data = "close";
  QVar21.m_size = 5;
  lVar7 = QtPrivate::findByteArray(QVar17,0,QVar21);
  bVar11 = true;
  if (lVar7 == -1) {
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char *)0x0;
    local_c8.d.size = 0;
    name_01.m_data = "proxy-connection";
    name_01.m_size = 0x10;
    QHttpNetworkHeaderPrivate::headerField(&local_b0,this_00,name_01,&local_c8);
    QByteArray::toLower_helper(&local_98);
    QVar18.m_data = local_98.d.ptr;
    QVar18.m_size = local_98.d.size;
    QVar22.m_data = "close";
    QVar22.m_size = 5;
    lVar9 = QtPrivate::findByteArray(QVar18,0,QVar22);
    if (lVar9 != -1) goto LAB_0020d950;
    iVar6 = QHttpHeaderParser::getMajorVersion(this_01);
    if (((iVar6 != 1) || (iVar6 = QHttpHeaderParser::getMinorVersion(this_01), iVar6 != 0)) ||
       ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) {
      bVar11 = false;
      goto LAB_0020d950;
    }
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (char *)0x0;
    local_118.d.size = 0;
    name_02.m_data = "proxy-connection";
    name_02.m_size = 0x10;
    QHttpNetworkHeaderPrivate::headerField(&local_f8,this_00,name_02,&local_118);
    QByteArray::toLower_helper(&local_e0);
    QVar19.m_data = local_e0.d.ptr;
    QVar19.m_size = local_e0.d.size;
    QVar23.m_data = "keep-alive";
    QVar23.m_size = 10;
    lVar9 = QtPrivate::findByteArray(QVar19,0,QVar23);
    this->connectionCloseEnabled = lVar9 == -1;
    if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
LAB_0020d950:
    this->connectionCloseEnabled = bVar11;
  }
  if (lVar7 == -1) {
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0020da33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar10;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readHeader(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // according to http://dev.opera.com/articles/view/mama-http-headers/ the average size of the header
        // block is 381 bytes.
        // reserve bytes. This is better than always append() which reallocs the byte array.
        fragment.reserve(512);
    }

    qint64 bytes = 0;
    char c = 0;
    bool allHeaders = false;
    qint64 haveRead = 0;
    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == 0) {
            // read more later
            break;
        } else if (haveRead == -1) {
            // connection broke down
            return -1;
        } else {
            fragment.append(c);
            bytes++;

            if (c == '\n') {
                // check for possible header endings. As per HTTP rfc,
                // the header endings will be marked by CRLFCRLF. But
                // we will allow CRLFCRLF, CRLFLF, LFCRLF, LFLF
                if (fragment.endsWith("\n\r\n")
                    || fragment.endsWith("\n\n"))
                    allHeaders = true;

                // there is another case: We have no headers. Then the fragment equals just the line ending
                if ((fragment.size() == 2 && fragment.endsWith("\r\n"))
                    || (fragment.size() == 1 && fragment.endsWith("\n")))
                    allHeaders = true;
            }
        }
    } while (!allHeaders && haveRead > 0);

    // we received all headers now parse them
    if (allHeaders) {
        parseHeader(fragment);
        state = ReadingDataState;
        fragment.clear(); // next fragment
        bodyLength = contentLength(); // cache the length

        // cache isChunked() since it is called often
        chunkedTransferEncoding = headerField("transfer-encoding").toLower().contains("chunked");

        // cache isConnectionCloseEnabled since it is called often
        QByteArray connectionHeaderField = headerField("connection");
        // check for explicit indication of close or the implicit connection close of HTTP/1.0
        connectionCloseEnabled = (connectionHeaderField.toLower().contains("close") ||
            headerField("proxy-connection").toLower().contains("close")) ||
            (parser.getMajorVersion() == 1 && parser.getMinorVersion() == 0 &&
            (connectionHeaderField.isEmpty() && !headerField("proxy-connection").toLower().contains("keep-alive")));
    }
    return bytes;
}